

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::HandleLevel0
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  _Self __tmp;
  const_iterator __last;
  allocator local_c9;
  _List_node_base *local_c8;
  cmConditionEvaluator *local_c0;
  string *local_b8;
  MessageType *local_b0;
  cmExpandedCommandArgument *local_a8;
  _List_node_base *local_a0;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> newArgs2;
  cmExpandedCommandArgument local_78;
  string local_50 [32];
  
  local_c8 = (_List_node_base *)newArgs;
  local_c0 = this;
  local_b8 = errorString;
  local_b0 = status;
  do {
    do {
      newArgs = (cmArgumentList *)((_List_node_base *)newArgs)->_M_next;
      if ((_List_node_base *)newArgs == local_c8) {
LAB_002ba5d4:
        return (_List_node_base *)newArgs == local_c8;
      }
      std::__cxx11::string::string((string *)&local_78,"(",(allocator *)local_50);
      bVar1 = IsKeyword(local_c0,&local_78.Value,(cmExpandedCommandArgument *)((long)newArgs + 0x10)
                       );
      std::__cxx11::string::~string((string *)&local_78);
    } while (!bVar1);
    iVar3 = 1;
    __last._M_node = (_List_node_base *)newArgs;
    local_a8 = (cmExpandedCommandArgument *)((long)newArgs + 0x10);
    local_a0 = (_List_node_base *)newArgs;
    while( true ) {
      newArgs = (cmArgumentList *)local_a0;
      __last._M_node = (__last._M_node)->_M_next;
      if ((__last._M_node == local_c8) || (iVar3 == 0)) break;
      std::__cxx11::string::string((string *)&local_78,"(",(allocator *)local_50);
      bVar1 = IsKeyword(local_c0,&local_78.Value,(cmExpandedCommandArgument *)(__last._M_node + 1));
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::string((string *)&local_78,")",(allocator *)local_50);
      bVar2 = IsKeyword(local_c0,&local_78.Value,(cmExpandedCommandArgument *)(__last._M_node + 1));
      std::__cxx11::string::~string((string *)&local_78);
      iVar3 = (iVar3 + (uint)bVar1) - (uint)bVar2;
    }
    if (iVar3 != 0) {
      std::__cxx11::string::assign((char *)local_b8);
      *local_b0 = FATAL_ERROR;
      newArgs = (cmArgumentList *)local_a0;
      goto LAB_002ba5d4;
    }
    newArgs2.
    super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    newArgs2.
    super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    newArgs2.
    super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
    insert<std::_List_iterator<cmExpandedCommandArgument>,void>
              ((vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>> *)
               &newArgs2,(const_iterator)0x0,local_a0->_M_next,
               (_List_iterator<cmExpandedCommandArgument>)__last._M_node);
    newArgs2.
    super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         newArgs2.
         super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
         _M_impl.super__Vector_impl_data._M_finish + -1;
    std::__cxx11::string::~string
              ((string *)
               newArgs2.
               super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    bVar1 = IsTrue(local_c0,&newArgs2,local_b8,local_b0);
    if (bVar1) {
      std::__cxx11::string::string(local_50,"1",&local_c9);
      std::__cxx11::string::string((string *)&local_78,local_50);
    }
    else {
      std::__cxx11::string::string(local_50,"0",&local_c9);
      std::__cxx11::string::string((string *)&local_78,local_50);
    }
    local_78.Quoted = true;
    cmExpandedCommandArgument::operator=(local_a8,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::erase
              ((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
               local_c8,((_List_node_base *)newArgs)->_M_next,__last);
    std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
              (&newArgs2);
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel0(cmArgumentList &newArgs,
                  std::string &errorString,
                  cmake::MessageType &status)
{
  int reducible;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    while (arg != newArgs.end())
      {
      if (IsKeyword("(", *arg))
        {
        // search for the closing paren for this opening one
        cmArgumentList::iterator argClose;
        argClose = arg;
        argClose++;
        unsigned int depth = 1;
        while (argClose != newArgs.end() && depth)
          {
          if (this->IsKeyword("(", *argClose))
            {
              depth++;
            }
          if (this->IsKeyword(")", *argClose))
            {
              depth--;
            }
          argClose++;
          }
        if (depth)
          {
          errorString = "mismatched parenthesis in condition";
          status = cmake::FATAL_ERROR;
          return false;
          }
        // store the reduced args in this vector
        std::vector<cmExpandedCommandArgument> newArgs2;

        // copy to the list structure
        cmArgumentList::iterator argP1 = arg;
        argP1++;
        newArgs2.insert(newArgs2.end(), argP1, argClose);
        newArgs2.pop_back();
        // now recursively invoke IsTrue to handle the values inside the
        // parenthetical expression
        bool value =
          this->IsTrue(newArgs2, errorString, status);
        if(value)
          {
          *arg = cmExpandedCommandArgument("1", true);
          }
        else
          {
          *arg = cmExpandedCommandArgument("0", true);
          }
        argP1 = arg;
        argP1++;
        // remove the now evaluated parenthetical expression
        newArgs.erase(argP1,argClose);
        }
      ++arg;
      }
    }
  while (reducible);
  return true;
}